

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O1

void __thiscall
trial::protocol::json::example::pretty_printer::print_array_element(pretty_printer *this,int count)

{
  value vVar1;
  size_type sVar2;
  error *this_00;
  error_code eVar3;
  error_code ec;
  view_type local_30;
  
  vVar1 = symbol(this);
  switch(vVar1) {
  case begin_array:
    if (0 < count) {
      local_30._M_len = 1;
      local_30._M_str = ",";
      basic_writer<char,_16UL>::literal(this->writer,&local_30);
      local_30._M_len = 1;
      local_30._M_str = "\n";
      basic_writer<char,_16UL>::literal(this->writer,&local_30);
    }
    print_array(this,true);
    break;
  case end_array:
    break;
  case begin_object:
    if (0 < count) {
      local_30._M_len = 1;
      local_30._M_str = ",";
      basic_writer<char,_16UL>::literal(this->writer,&local_30);
      local_30._M_len = 1;
      local_30._M_str = "\n";
      basic_writer<char,_16UL>::literal(this->writer,&local_30);
    }
    print_object(this,true);
    break;
  case end_object:
    this_00 = (error *)__cxa_allocate_exception(0x20);
    eVar3 = make_error_code(unbalanced_end_object);
    ec._M_cat = eVar3._M_cat;
    ec._4_4_ = 0;
    ec._M_value = eVar3._M_value;
    error::error(this_00,ec);
    __cxa_throw(this_00,&error::typeinfo,std::system_error::~system_error);
  default:
    if (0 < count) {
      local_30._M_len = 1;
      local_30._M_str = ",";
      basic_writer<char,_16UL>::literal(this->writer,&local_30);
      local_30._M_len = 1;
      local_30._M_str = "\n";
      basic_writer<char,_16UL>::literal(this->writer,&local_30);
    }
    sVar2 = basic_reader<char>::level(this->reader);
    indent(this,(int)sVar2);
    print_value(this);
  }
  return;
}

Assistant:

void print_array_element(int count)
    {
        switch (symbol())
        {
        case json::token::symbol::begin_array:
            if (count > 0)
            {
                writer.literal(",");
                newline();
            }
            print_array(true);
            break;

        case json::token::symbol::end_array:
            break;

        case json::token::symbol::begin_object:
            if (count > 0)
            {
                writer.literal(",");
                newline();
            }
            print_object(true);
            break;

        case json::token::symbol::end_object:
            throw json::error(make_error_code(json::unbalanced_end_object));

        default:
            if (count > 0)
            {
                writer.literal(",");
                newline();
            }
            indent(reader.level());
            print_value();
            break;
        }
    }